

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O3

void __thiscall
xmrig::HttpsClient::HttpsClient
          (HttpsClient *this,int method,String *url,IHttpListener *listener,char *data,size_t size,
          String *fingerprint)

{
  SSL_METHOD *meth;
  SSL_CTX *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  
  HttpClient::HttpClient(&this->super_HttpClient,method,url,listener,data,size);
  (this->super_HttpClient).super_HttpContext._vptr_HttpContext =
       (_func_int **)&PTR__HttpsClient_001adce8;
  (this->super_HttpClient).super_IDnsListener._vptr_IDnsListener =
       (_func_int **)&PTR__HttpsClient_001add28;
  this->m_ssl = (SSL *)0x0;
  memset(&this->m_ready,0,0x801);
  String::String(&this->m_fp,fingerprint);
  meth = (SSL_METHOD *)TLS_method();
  pSVar1 = SSL_CTX_new(meth);
  this->m_ctx = (SSL_CTX *)pSVar1;
  if (pSVar1 != (SSL_CTX *)0x0) {
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    this->m_writeBio = (BIO *)pBVar3;
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    this->m_readBio = (BIO *)pBVar3;
    SSL_CTX_set_options(this->m_ctx,0x2000000);
  }
  return;
}

Assistant:

xmrig::HttpsClient::HttpsClient(int method, const String &url, IHttpListener *listener, const char *data, size_t size, const String &fingerprint) :
    HttpClient(method, url, listener, data, size),
    m_ready(false),
    m_buf(),
    m_ssl(nullptr),
    m_fp(fingerprint)
{
    m_ctx = SSL_CTX_new(SSLv23_method());
    assert(m_ctx != nullptr);

    if (!m_ctx) {
        return;
    }

    m_writeBio = BIO_new(BIO_s_mem());
    m_readBio  = BIO_new(BIO_s_mem());
    SSL_CTX_set_options(m_ctx, SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
}